

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

uint __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Split
          (PageStack<Memory::MarkContext::MarkCandidate> *this,uint targetCount,
          PageStack<Memory::MarkContext::MarkCandidate> **targetStacks)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  uint local_54;
  Chunk *pCStack_50;
  uint targetIndex;
  Chunk *chunk;
  Chunk *targetCurrents [3];
  Chunk *local_28;
  Chunk *mainCurrent;
  PageStack<Memory::MarkContext::MarkCandidate> **targetStacks_local;
  uint targetCount_local;
  PageStack<Memory::MarkContext::MarkCandidate> *this_local;
  
  if ((targetCount == 0) || (3 < targetCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfa,"(targetCount > 0 && targetCount <= MaxSplitTargets)",
                       "targetCount > 0 && targetCount <= MaxSplitTargets");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (targetStacks == (PageStack<Memory::MarkContext::MarkCandidate> **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfb,"(targetStacks)","targetStacks");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_28 = this->currentChunk;
  if (local_28 == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x106,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pCStack_50 = local_28->nextChunk;
  local_54 = 0;
  do {
    targetStacks_local._4_4_ = targetCount;
    if (targetCount <= local_54) {
LAB_003ce748:
      while (pCStack_50 != (Chunk *)0x0) {
        local_28->nextChunk = pCStack_50;
        local_28 = pCStack_50;
        pCStack_50 = pCStack_50->nextChunk;
        local_54 = 0;
        for (; (local_54 < targetStacks_local._4_4_ && (pCStack_50 != (Chunk *)0x0));
            pCStack_50 = pCStack_50->nextChunk) {
          targetCurrents[(ulong)local_54 - 1]->nextChunk = pCStack_50;
          targetCurrents[(ulong)local_54 - 1] = pCStack_50;
          this->pageCount = this->pageCount - 1;
          targetStacks[local_54]->pageCount = targetStacks[local_54]->pageCount + 1;
          this->count = this->count - 0xfe;
          targetStacks[local_54]->count = targetStacks[local_54]->count + 0xfe;
          local_54 = local_54 + 1;
        }
      }
      local_28->nextChunk = (Chunk *)0x0;
      for (local_54 = 0; local_54 < targetStacks_local._4_4_; local_54 = local_54 + 1) {
        targetCurrents[(ulong)local_54 - 1]->nextChunk = (Chunk *)0x0;
      }
      return targetStacks_local._4_4_;
    }
    if (pCStack_50 == (Chunk *)0x0) {
      targetStacks_local._4_4_ = local_54;
      goto LAB_003ce748;
    }
    bVar2 = IsEmpty(targetStacks[local_54]);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x11a,"(targetStacks[targetIndex]->IsEmpty())",
                         "targetStacks[targetIndex]->IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    Release(targetStacks[local_54]);
    targetStacks[local_54]->currentChunk = pCStack_50;
    targetStacks[local_54]->chunkStart = (MarkCandidate *)(pCStack_50 + 1);
    targetStacks[local_54]->chunkEnd = (MarkCandidate *)(pCStack_50 + 0x80);
    targetStacks[local_54]->nextEntry = targetStacks[local_54]->chunkEnd;
    this->pageCount = this->pageCount - 1;
    targetStacks[local_54]->pageCount = 1;
    this->count = this->count - 0xfe;
    targetStacks[local_54]->count = 0xfe;
    targetCurrents[(ulong)local_54 - 1] = pCStack_50;
    pCStack_50 = pCStack_50->nextChunk;
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

uint PageStack<T>::Split(uint targetCount, __in_ecount(targetCount) PageStack<T> ** targetStacks)
{
    // Split the current stack up to [targetCount + 1] ways.
    // [targetStacks] contains the target stacks and must have [targetCount] elements.

    Assert(targetCount > 0 && targetCount <= MaxSplitTargets);
    Assert(targetStacks);
    __analysis_assume(targetCount <= MaxSplitTargets);

    Chunk * mainCurrent;
    Chunk * targetCurrents[MaxSplitTargets];

    // Do the initial split of first pages for each target stack.
    // During this, if we run out of pages, we will return a value < maxSplit to
    // indicate that the split was less than the maximum possible.

    Chunk * chunk = this->currentChunk;
    Assert(chunk != nullptr);

    // The first chunk is assigned to the main stack, and since it's already there,
    // we just advance to the next chunk and start assigning to each target stack.
    mainCurrent = chunk;
    chunk = chunk->nextChunk;

    uint targetIndex = 0;
    while (targetIndex < targetCount)
    {
        if (chunk == nullptr)
        {
            // No more pages.  Adjust targetCount down to what we were actually able to do.
            // We'll return this number below so the caller knows.
            targetCount = targetIndex;
            break;
        }

        // Target stack should be empty.
        // If it has a free page currently, release it.
        Assert(targetStacks[targetIndex]->IsEmpty());
        targetStacks[targetIndex]->Release();

        targetStacks[targetIndex]->currentChunk = chunk;
        targetStacks[targetIndex]->chunkStart = chunk->entries;
        targetStacks[targetIndex]->chunkEnd = &chunk->entries[EntriesPerChunk];
        targetStacks[targetIndex]->nextEntry = targetStacks[targetIndex]->chunkEnd;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        this->pageCount--;
        targetStacks[targetIndex]->pageCount = 1;
#endif
#if DBG
        this->count -= EntriesPerChunk;
        targetStacks[targetIndex]->count = EntriesPerChunk;
#endif

        targetCurrents[targetIndex] = chunk;

        chunk = chunk->nextChunk;
        targetIndex++;
    }

    // Loop through the remaining chunks (if any),
    // assigning each chunk to the main chunk and the target chunks in turn,
    // and linking each chunk to the end of the respective list.
    while (true)
    {
        if (chunk == nullptr)
        {
            break;
        }

        mainCurrent->nextChunk = chunk;
        mainCurrent = chunk;

        chunk = chunk->nextChunk;

        targetIndex = 0;
        while (targetIndex < targetCount)
        {
            if (chunk == nullptr)
            {
                break;
            }

            targetCurrents[targetIndex]->nextChunk = chunk;
            targetCurrents[targetIndex] = chunk;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            this->pageCount--;
            targetStacks[targetIndex]->pageCount++;
#endif
#if DBG
            this->count -= EntriesPerChunk;
            targetStacks[targetIndex]->count += EntriesPerChunk;
#endif

            chunk = chunk->nextChunk;
            targetIndex++;
        }
    }

    // Terminate all the split chunk lists with null
    mainCurrent->nextChunk = nullptr;
    targetIndex = 0;
    while (targetIndex < targetCount)
    {
        targetCurrents[targetIndex]->nextChunk = nullptr;
        targetIndex++;
    }

    // Return the actual split count we were able to do, which may have been lowered above.
    return targetCount;
}